

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getMemory
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name *mem)

{
  pointer puVar1;
  Memory *pMVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  string local_70;
  Err local_50;
  allocator<char> local_29;
  
  if (mem == (Name *)0x0) {
    puVar1 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 == (this->wasm->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"memory required, but there is no memory",&local_29);
      Lexer::err(&local_50,&this->in,(ulong)pos,&local_70);
      std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      return __return_storage_ptr__;
    }
    pMVar2 = (puVar1->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar3 = *(undefined4 *)&(pMVar2->super_Importable).super_Named;
    uVar4 = *(undefined4 *)((long)&(pMVar2->super_Importable).super_Named + 4);
    uVar5 = *(undefined4 *)((long)&(pMVar2->super_Importable).super_Named + 8);
    uVar6 = *(undefined4 *)((long)&(pMVar2->super_Importable).super_Named + 0xc);
  }
  else {
    uVar3 = (undefined4)(mem->super_IString).str._M_len;
    uVar4 = *(undefined4 *)((long)&(mem->super_IString).str._M_len + 4);
    uVar5 = *(undefined4 *)&(mem->super_IString).str._M_str;
    uVar6 = *(undefined4 *)((long)&(mem->super_IString).str._M_str + 4);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err> = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 4) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0xc) = uVar6;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getMemory(Index pos, Name* mem) {
    if (mem) {
      return *mem;
    }
    if (wasm.memories.empty()) {
      return in.err(pos, "memory required, but there is no memory");
    }
    return wasm.memories[0]->name;
  }